

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov5_pnnx.cpp
# Opt level: O2

void generate_proposals(Mat *anchors,int stride,Mat *in_pad,Mat *feat_blob,float prob_threshold,
                       vector<Object,_std::allocator<Object>_> *objects)

{
  undefined8 uVar1;
  size_t sVar2;
  size_t sVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  float *pfVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int i;
  ulong uVar18;
  int j;
  ulong uVar19;
  ulong uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined4 uVar24;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 uVar25;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  long local_120;
  value_type local_a0;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  float local_68;
  undefined4 uStack_64;
  double dStack_60;
  float local_58;
  float local_48;
  
  uVar12 = (long)anchors->w / 2;
  iVar11 = (int)uVar12;
  iVar6 = in_pad->c / iVar11;
  local_88 = (float)stride;
  uVar8 = 0;
  uVar20 = (ulong)(iVar6 - 5U);
  if ((int)(iVar6 - 5U) < 1) {
    uVar20 = uVar8;
  }
  uVar14 = (ulong)(uint)in_pad->w;
  if (in_pad->w < 1) {
    uVar14 = uVar8;
  }
  uVar15 = (ulong)(uint)in_pad->h;
  if (in_pad->h < 1) {
    uVar15 = uVar8;
  }
  uVar12 = uVar12 & 0xffffffff;
  if (iVar11 < 1) {
    uVar12 = uVar8;
  }
  local_120 = 5;
  fStack_84 = local_88;
  fStack_80 = local_88;
  fStack_7c = local_88;
  for (; uVar8 != uVar12; uVar8 = uVar8 + 1) {
    lVar10 = uVar8 * (long)iVar6;
    uVar1 = *(undefined8 *)((long)anchors->data + uVar8 * 8);
    dVar4 = (double)(float)uVar1;
    uVar24 = (undefined4)((ulong)dVar4 >> 0x20);
    dVar5 = (double)(float)((ulong)uVar1 >> 0x20);
    local_78._8_4_ = SUB84(dVar5,0);
    local_78._0_8_ = dVar4;
    local_78._12_4_ = (int)((ulong)dVar5 >> 0x20);
    for (uVar18 = 0; uVar18 != uVar15; uVar18 = uVar18 + 1) {
      local_68 = (float)(int)uVar18;
      lVar9 = 0;
      uStack_64 = uVar24;
      dStack_60 = dVar5;
      for (uVar19 = 0; uVar19 != uVar14; uVar19 = uVar19 + 1) {
        sVar2 = in_pad->elemsize;
        sVar3 = in_pad->cstep;
        lVar7 = (long)in_pad->w * uVar18;
        pfVar13 = (float *)((long)in_pad->data + lVar9 + (local_120 * sVar3 + lVar7) * sVar2);
        fVar27 = -3.4028235e+38;
        uVar17 = 0;
        for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 1) {
          if (fVar27 < *pfVar13) {
            uVar17 = uVar16 & 0xffffffff;
            fVar27 = *pfVar13;
          }
          pfVar13 = (float *)((long)pfVar13 + sVar3 * sVar2);
        }
        fVar21 = sigmoid(*(float *)((long)in_pad->data +
                                   uVar19 * 4 + sVar3 * (lVar10 + 4) * sVar2 + lVar7 * sVar2));
        fVar27 = sigmoid(fVar27);
        uVar24 = extraout_XMM0_Db;
        uVar25 = extraout_XMM0_Dc;
        uVar26 = extraout_XMM0_Dd;
        if (0.25 <= fVar27 * fVar21) {
          fVar22 = sigmoid(*(float *)((long)in_pad->data +
                                     uVar19 * 4 +
                                     (long)in_pad->w * uVar18 * in_pad->elemsize +
                                     in_pad->cstep * lVar10 * in_pad->elemsize));
          local_48 = sigmoid(*(float *)((long)in_pad->data +
                                       uVar19 * 4 +
                                       (long)in_pad->w * uVar18 * in_pad->elemsize +
                                       in_pad->cstep * (lVar10 + 1) * in_pad->elemsize));
          local_58 = sigmoid(*(float *)((long)in_pad->data +
                                       uVar19 * 4 +
                                       (long)in_pad->w * uVar18 * in_pad->elemsize +
                                       in_pad->cstep * (lVar10 + 2) * in_pad->elemsize));
          fVar23 = sigmoid(*(float *)((long)in_pad->data +
                                     uVar19 * 4 +
                                     (long)in_pad->w * uVar18 * in_pad->elemsize +
                                     in_pad->cstep * (lVar10 + 3) * in_pad->elemsize));
          fVar28 = (fVar22 + fVar22 + -0.5 + (float)(int)uVar19) * local_88;
          fVar29 = (local_48 + local_48 + -0.5 + local_68) * fStack_84;
          fVar22 = (float)((double)(local_58 + local_58) * (double)(local_58 + local_58) *
                          (double)local_78._0_8_) * 0.5;
          fVar23 = (float)((double)(fVar23 + fVar23) * (double)(fVar23 + fVar23) *
                          (double)local_78._8_8_) * 0.5;
          local_a0.rect.x = fVar28 - fVar22;
          local_a0.rect.y = fVar29 - fVar23;
          local_a0.rect.width = (fVar22 + fVar28) - local_a0.rect.x;
          local_a0.rect.height = (fVar23 + fVar29) - local_a0.rect.y;
          local_a0.label = (int)uVar17;
          local_a0.prob = fVar27 * fVar21;
          std::vector<Object,_std::allocator<Object>_>::push_back
                    ((vector<Object,_std::allocator<Object>_> *)feat_blob,&local_a0);
          uVar24 = extraout_XMM0_Db_00;
          uVar25 = extraout_XMM0_Dc_00;
          uVar26 = extraout_XMM0_Dd_00;
        }
        dVar5 = (double)CONCAT44(uVar26,uVar25);
        lVar9 = lVar9 + 4;
      }
    }
    local_120 = local_120 + iVar6;
  }
  return;
}

Assistant:

static void generate_proposals(const ncnn::Mat& anchors, int stride, const ncnn::Mat& in_pad, const ncnn::Mat& feat_blob, float prob_threshold, std::vector<Object>& objects)
{
    const int num_grid_x = feat_blob.w;
    const int num_grid_y = feat_blob.h;

    const int num_anchors = anchors.w / 2;

    const int num_class = feat_blob.c / num_anchors - 5;

    const int feat_offset = num_class + 5;

    for (int q = 0; q < num_anchors; q++)
    {
        const float anchor_w = anchors[q * 2];
        const float anchor_h = anchors[q * 2 + 1];

        for (int i = 0; i < num_grid_y; i++)
        {
            for (int j = 0; j < num_grid_x; j++)
            {
                // find class index with max class score
                int class_index = 0;
                float class_score = -FLT_MAX;
                for (int k = 0; k < num_class; k++)
                {
                    float score = feat_blob.channel(q * feat_offset + 5 + k).row(i)[j];
                    if (score > class_score)
                    {
                        class_index = k;
                        class_score = score;
                    }
                }

                float box_score = feat_blob.channel(q * feat_offset + 4).row(i)[j];

                float confidence = sigmoid(box_score) * sigmoid(class_score);

                if (confidence >= prob_threshold)
                {
                    // yolov5/models/yolo.py Detect forward
                    // y = x[i].sigmoid()
                    // y[..., 0:2] = (y[..., 0:2] * 2. - 0.5 + self.grid[i].to(x[i].device)) * self.stride[i]  # xy
                    // y[..., 2:4] = (y[..., 2:4] * 2) ** 2 * self.anchor_grid[i]  # wh

                    float dx = sigmoid(feat_blob.channel(q * feat_offset + 0).row(i)[j]);
                    float dy = sigmoid(feat_blob.channel(q * feat_offset + 1).row(i)[j]);
                    float dw = sigmoid(feat_blob.channel(q * feat_offset + 2).row(i)[j]);
                    float dh = sigmoid(feat_blob.channel(q * feat_offset + 3).row(i)[j]);

                    float pb_cx = (dx * 2.f - 0.5f + j) * stride;
                    float pb_cy = (dy * 2.f - 0.5f + i) * stride;

                    float pb_w = pow(dw * 2.f, 2) * anchor_w;
                    float pb_h = pow(dh * 2.f, 2) * anchor_h;

                    float x0 = pb_cx - pb_w * 0.5f;
                    float y0 = pb_cy - pb_h * 0.5f;
                    float x1 = pb_cx + pb_w * 0.5f;
                    float y1 = pb_cy + pb_h * 0.5f;

                    Object obj;
                    obj.rect.x = x0;
                    obj.rect.y = y0;
                    obj.rect.width = x1 - x0;
                    obj.rect.height = y1 - y0;
                    obj.label = class_index;
                    obj.prob = confidence;

                    objects.push_back(obj);
                }
            }
        }
    }
}